

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O1

void skiwi::compile_read_char(asmcode *code,compiler_options *ops)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  skiwi *psVar2;
  uint64_t in_RDX;
  uint64_t lab;
  uint64_t lab_00;
  string no_buffer_read;
  string eof_lab;
  string error;
  operand local_98 [2];
  code *local_90;
  operand local_84;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  psVar2 = label;
  paVar1 = &local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_80,psVar2,in_RDX);
    std::__cxx11::string::operator=((string *)&local_40,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    local_80._M_dataplus._M_p._0_4_ = 5;
    local_60._M_dataplus._M_p._0_4_ = 0x14;
    local_90 = (code *)CONCAT44(local_90._4_4_,0x39);
    local_98[0] = AL;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_80,(operand *)&local_60,(operand *)&local_90,(int *)local_98
              );
    local_80._M_dataplus._M_p._0_4_ = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_80,&local_40);
    jump_if_arg_is_not_block(code,RCX,R11,&local_40);
  }
  local_60._M_dataplus._M_p._0_4_ = 2;
  local_90 = (code *)CONCAT44(local_90._4_4_,0xb);
  local_98[0] = NUMBER;
  local_80._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,(operation *)&local_60,(operand *)&local_90,local_98,(unsigned_long *)&local_80);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_port(code,RCX,R11,&local_40);
  }
  local_80._M_dataplus._M_p._0_4_ = 0x40;
  local_60._M_dataplus._M_p._0_4_ = 0x14;
  local_90._0_4_ = 0x1b;
  local_98[0] = MEM_R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_80,(operand *)&local_60,(operand *)&local_90,(int *)local_98);
  local_80._M_dataplus._M_p._0_4_ = 0x40;
  local_60._M_dataplus._M_p._0_4_ = 0x18;
  local_90._0_4_ = 0x1b;
  local_98[0] = BYTE_MEM_R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_80,(operand *)&local_60,(operand *)&local_90,(int *)local_98);
  psVar2 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_80,psVar2,lab);
  psVar2 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_60,psVar2,lab_00);
  local_90._0_4_ = 5;
  local_98[0] = R11;
  local_98[1] = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_90,local_98,local_98 + 1);
  local_90._0_4_ = 0x30;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_90,&local_80);
  local_90 = (code *)CONCAT44(local_90._4_4_,0x40);
  local_98[0] = R11;
  local_98[1] = 0x1b;
  local_84 = MEM_RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_90,local_98,local_98 + 1,(int *)&local_84);
  local_98[0] = AH;
  local_98[1] = 0x14;
  local_84 = NUMBER;
  local_90 = (code *)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_98,local_98 + 1,&local_84,(unsigned_long *)&local_90);
  local_90._0_4_ = 0x4b;
  local_98[0] = RDI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_90,local_98);
  local_90._0_4_ = 0x4b;
  local_98[0] = RSI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_90,local_98);
  local_90._0_4_ = 0x4b;
  local_98[0] = RDX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_90,local_98);
  local_90._0_4_ = 0x40;
  local_98[0] = RDI;
  local_98[1] = 0x1b;
  local_84 = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_90,local_98,local_98 + 1,(int *)&local_84);
  local_90._0_4_ = 0x4e;
  local_98[0] = RDI;
  local_98[1] = 0x39;
  local_84 = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_90,local_98,local_98 + 1,(int *)&local_84);
  local_90._0_4_ = 0x40;
  local_98[0] = RDX;
  local_98[1] = 0x1b;
  local_84 = MEM_R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_90,local_98,local_98 + 1,(int *)&local_84);
  local_90._0_4_ = 0x4e;
  local_98[0] = RDX;
  local_98[1] = 0x39;
  local_84 = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_90,local_98,local_98 + 1,(int *)&local_84);
  local_90._0_4_ = 0x40;
  local_98[0] = RSI;
  local_98[1] = 0x14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_90,local_98,local_98 + 1);
  local_90._0_4_ = 0;
  local_98[0] = RSI;
  local_98[1] = 0x39;
  local_84 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_90,local_98,local_98 + 1,(int *)&local_84);
  save_before_foreign_call(code);
  align_stack(code);
  local_90._0_4_ = 0x40;
  local_98[0] = R15;
  local_98[1] = 0x13;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_90,local_98,local_98 + 1);
  local_90 = (code *)CONCAT44(local_90._4_4_,0x5c);
  local_98[0] = RAX;
  local_98[1] = 9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_90,local_98,local_98 + 1);
  local_98[0] = ST6;
  local_98[1] = 0x14;
  local_84 = NUMBER;
  local_90 = _skiwi_read;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_98,local_98 + 1,&local_84,(unsigned_long *)&local_90);
  local_90._0_4_ = 4;
  local_98[0] = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_90,local_98);
  local_90._0_4_ = 0x40;
  local_98[0] = R10;
  local_98[1] = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_90,local_98,local_98 + 1);
  restore_stack(code);
  restore_after_foreign_call(code);
  local_90._0_4_ = 0x4a;
  local_98[0] = RDX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_90,local_98);
  local_90._0_4_ = 0x4a;
  local_98[0] = RSI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_90,local_98);
  local_90._0_4_ = 0x4a;
  local_98[0] = RDI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_90,local_98);
  local_90._0_4_ = 0x55;
  local_98[0] = RAX;
  local_98[1] = 0x39;
  local_84 = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_90,local_98,local_98 + 1,(int *)&local_84);
  local_90._0_4_ = 0x40;
  local_98[0] = MEM_RCX;
  local_98[1] = 0x38;
  local_84 = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_90,local_98,(int *)(local_98 + 1),&local_84);
  local_90._0_4_ = 5;
  local_98[0] = RAX;
  local_98[1] = 0x39;
  local_84 = EMPTY;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_90,local_98,local_98 + 1,(int *)&local_84);
  local_90._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_90,&local_60);
  local_90._0_4_ = 0x5c;
  local_98[0] = R11;
  local_98[1] = 0x14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_90,local_98,local_98 + 1);
  local_90._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_90,&local_80);
  local_90._0_4_ = 0x40;
  local_98[0] = R15;
  local_98[1] = 0x1b;
  local_84 = MEM_RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_90,local_98,local_98 + 1,(int *)&local_84);
  local_90 = (code *)CONCAT44(local_90._4_4_,0x4e);
  local_98[0] = R11;
  local_98[1] = 0x39;
  local_84 = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_90,local_98,local_98 + 1,(int *)&local_84);
  local_98[0] = AH;
  local_98[1] = 0x18;
  local_84 = NUMBER;
  local_90 = (code *)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_98,local_98 + 1,&local_84,(unsigned_long *)&local_90);
  local_90 = (code *)((ulong)local_90 & 0xffffffff00000000);
  local_98[0] = R11;
  local_98[1] = 0x39;
  local_84 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_90,local_98,local_98 + 1,(int *)&local_84);
  local_90 = (code *)((ulong)local_90 & 0xffffffff00000000);
  local_98[0] = R15;
  local_98[1] = 0x14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_90,local_98,local_98 + 1);
  local_90._0_4_ = 0x40;
  local_98[0] = AL;
  local_98[1] = 0x38;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_90,local_98,local_98 + 1);
  local_90._0_4_ = 0x44;
  local_98[0] = RAX;
  local_98[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_90,local_98,local_98 + 1);
  local_90._0_4_ = 0x55;
  local_98[0] = RAX;
  local_98[1] = 0x39;
  local_84 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_90,local_98,local_98 + 1,(int *)&local_84);
  local_90._0_4_ = 0x49;
  local_98[0] = RAX;
  local_98[1] = 0x39;
  local_84 = R14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_90,local_98,local_98 + 1,(int *)&local_84);
  local_90._0_4_ = 0x58;
  local_98[0] = R11;
  local_98[1] = 0x39;
  local_84 = DL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_90,local_98,local_98 + 1,(int *)&local_84);
  local_90._0_4_ = 0x55;
  local_98[0] = R11;
  local_98[1] = 0x39;
  local_84 = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_90,local_98,local_98 + 1,(int *)&local_84);
  local_90._0_4_ = 0x40;
  local_98[0] = MEM_RCX;
  local_98[1] = 0x28;
  local_84 = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_90,local_98,(int *)(local_98 + 1),&local_84);
  local_90._0_4_ = 0x2c;
  local_98[0] = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_90,local_98);
  local_90._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_90,&local_60);
  local_90._0_4_ = 0x40;
  local_98[0] = RAX;
  local_98[1] = 0x39;
  local_84 = XMM4;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_90,local_98,local_98 + 1,(int *)&local_84);
  local_90 = (code *)CONCAT44(local_90._4_4_,0x2c);
  local_98[0] = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_90,local_98);
  if (ops->safe_primitives == true) {
    error_label(code,&local_40,re_read_char_contract_violation);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_) !=
      &local_60.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_),
                    local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void compile_read_char(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
    code.add(asmcode::JNE, error);
    jump_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_port(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::MOV, asmcode::R11, asmcode::MEM_RCX, CELLS(5));
  code.add(asmcode::MOV, asmcode::R15, asmcode::MEM_RCX, CELLS(7)); // get the number of bytes read

  // rcx contains port
  // r11 contains index
  // r15 contains number of bytes read

  auto no_buffer_read = label_to_string(label++);
  auto eof_lab = label_to_string(label++);
  code.add(asmcode::CMP, asmcode::R11, asmcode::R15);
  code.add(asmcode::JL, no_buffer_read);
  // start reading buffer
  code.add(asmcode::MOV, asmcode::R11, asmcode::MEM_RCX, CELLS(4)); // pointer to string
  code.add(asmcode::AND, asmcode::R11, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);

#ifdef _WIN32
  code.add(asmcode::PUSH, asmcode::RCX);
  code.add(asmcode::PUSH, asmcode::RDX);
  code.add(asmcode::PUSH, asmcode::R8);

  code.add(asmcode::MOV, asmcode::R8, asmcode::MEM_RCX, CELLS(5)); // index
  code.add(asmcode::SAR, asmcode::R8, asmcode::NUMBER, 1);
  code.add(asmcode::MOV, asmcode::RDX, asmcode::R11);
  code.add(asmcode::ADD, asmcode::RDX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RCX, CELLS(3)); // filehandle
  code.add(asmcode::SAR, asmcode::RCX, asmcode::NUMBER, 1);

#else
  code.add(asmcode::PUSH, asmcode::RDI);
  code.add(asmcode::PUSH, asmcode::RSI);
  code.add(asmcode::PUSH, asmcode::RDX);

  code.add(asmcode::MOV, asmcode::RDI, asmcode::MEM_RCX, CELLS(3)); // filehandle
  code.add(asmcode::SAR, asmcode::RDI, asmcode::NUMBER, 1);
  code.add(asmcode::MOV, asmcode::RDX, asmcode::MEM_RCX, CELLS(5)); // index
  code.add(asmcode::SAR, asmcode::RDX, asmcode::NUMBER, 1);
  code.add(asmcode::MOV, asmcode::RSI, asmcode::R11);
  code.add(asmcode::ADD, asmcode::RSI, asmcode::NUMBER, CELLS(1));
#endif

  save_before_foreign_call(code);
  align_stack(code);
  code.add(asmcode::MOV, asmcode::R15, CONTEXT); // r15 should be saved by the callee but r10 not, so we save the context in r15
#ifdef _WIN32
  code.add(asmcode::SUB, asmcode::RSP, asmcode::NUMBER, 32);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, (uint64_t)&_skiwi_read);
#else
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, (uint64_t)&_skiwi_read);
#endif  
  code.add(asmcode::CALLEXTERNAL, asmcode::R11);
  code.add(asmcode::MOV, CONTEXT, asmcode::R15); // now we restore the context
  restore_stack(code);
  restore_after_foreign_call(code);

#ifdef _WIN32
  code.add(asmcode::POP, asmcode::R8);
  code.add(asmcode::POP, asmcode::RDX);
  code.add(asmcode::POP, asmcode::RCX);
#else
  code.add(asmcode::POP, asmcode::RDX);
  code.add(asmcode::POP, asmcode::RSI);
  code.add(asmcode::POP, asmcode::RDI);
#endif
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::MOV, asmcode::MEM_RCX, CELLS(7), asmcode::RAX); // store the number of bytes read
  code.add(asmcode::CMP, asmcode::RAX, asmcode::NUMBER, 0);
  code.add(asmcode::JES, eof_lab);
  code.add(asmcode::XOR, asmcode::R11, asmcode::R11);
  code.add(asmcode::LABEL, no_buffer_read);
  code.add(asmcode::MOV, asmcode::R15, asmcode::MEM_RCX, CELLS(4));
  code.add(asmcode::SAR, asmcode::R11, asmcode::NUMBER, 1);
  code.add(asmcode::AND, asmcode::R15, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8); // get address to string
  code.add(asmcode::ADD, asmcode::R11, asmcode::NUMBER, 8); // increase 8 for header
  code.add(asmcode::ADD, asmcode::R15, asmcode::R11);
  code.add(asmcode::MOV, asmcode::AL, asmcode::BYTE_MEM_R15);
  code.add(asmcode::MOVZX, asmcode::RAX, asmcode::AL);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 8);
  code.add(asmcode::OR, asmcode::RAX, asmcode::NUMBER, char_tag);

  code.add(asmcode::SUB, asmcode::R11, asmcode::NUMBER, 7);
  code.add(asmcode::SHL, asmcode::R11, asmcode::NUMBER, 1);
  code.add(asmcode::MOV, asmcode::MEM_RCX, CELLS(5), asmcode::R11); //update index

  code.add(asmcode::JMP, CONTINUE);
  code.add(asmcode::LABEL, eof_lab);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, eof_tag);
  code.add(asmcode::JMP, CONTINUE);

  if (ops.safe_primitives)
    {
    error_label(code, error, re_read_char_contract_violation);
    }
  }